

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  time_t tVar2;
  ulong uVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar4;
  undefined1 local_1;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  uVar3 = al_install_system(0x5020700,atexit);
  if ((uVar3 & 1) == 0) {
    debug_message("Error initialising Allegro.\n");
    local_1 = 0;
    uVar4 = extraout_var;
  }
  else {
    al_set_org_name("Allegro");
    al_set_app_name("Cosmic Protector");
    al_init_image_addon();
    al_init_font_addon();
    al_init_acodec_addon();
    al_init_primitives_addon();
    bVar1 = loadResources();
    if (bVar1) {
      local_1 = 1;
      uVar4 = extraout_var_00;
    }
    else {
      debug_message("Error loading resources.\n");
      local_1 = 0;
      uVar4 = extraout_var_01;
    }
  }
  return (int)CONCAT71(uVar4,local_1);
}

Assistant:

bool init(void)
{
   srand(time(NULL));
   if (!al_init()) {
      debug_message("Error initialising Allegro.\n");
      return false;
   }
   al_set_org_name("Allegro");
   al_set_app_name("Cosmic Protector");
   al_init_image_addon();
   al_init_font_addon();
   al_init_acodec_addon();
   al_init_primitives_addon();
#ifdef ALLEGRO_ANDROID
   al_android_set_apk_file_interface();
#endif

   if (!loadResources()) {
      debug_message("Error loading resources.\n");
      return false;
   }

   return true;
}